

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_v_predictor_16x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  unkuint9 Var8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [16];
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  undefined1 auVar35 [16];
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar51 [16];
  short sVar58;
  
  auVar13 = _DAT_005102c0;
  auVar15 = pshuflw(ZEXT116(left_column[7]),ZEXT116(left_column[7]),0);
  auVar16._0_2_ = auVar15._0_2_;
  sVar50 = auVar15._2_2_;
  auVar16._2_2_ = sVar50 * 0x3b;
  auVar16._4_2_ = auVar16._0_2_ * 0x6e;
  auVar16._6_2_ = sVar50 * 0x97;
  auVar16._8_2_ = auVar16._0_2_ * 0xb7;
  auVar16._10_2_ = sVar50 * 0xce;
  auVar16._12_2_ = auVar16._0_2_ * 0xdb;
  auVar16._14_2_ = sVar50 * 0xe0;
  auVar15 = *(undefined1 (*) [16])top_row;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar15._0_13_;
  auVar1[0xe] = auVar15[7];
  auVar2[0xc] = auVar15[6];
  auVar2._0_12_ = auVar15._0_12_;
  auVar2._13_2_ = auVar1._13_2_;
  auVar3[0xb] = 0;
  auVar3._0_11_ = auVar15._0_11_;
  auVar3._12_3_ = auVar2._12_3_;
  auVar4[10] = auVar15[5];
  auVar4._0_10_ = auVar15._0_10_;
  auVar4._11_4_ = auVar3._11_4_;
  auVar5[9] = 0;
  auVar5._0_9_ = auVar15._0_9_;
  auVar5._10_5_ = auVar4._10_5_;
  auVar6[8] = auVar15[4];
  auVar6._0_8_ = auVar15._0_8_;
  auVar6._9_6_ = auVar5._9_6_;
  auVar7._7_8_ = 0;
  auVar7._0_7_ = auVar6._8_7_;
  Var8 = CONCAT81(SUB158(auVar7 << 0x40,7),auVar15[3]);
  auVar11._9_6_ = 0;
  auVar11._0_9_ = Var8;
  auVar9._1_10_ = SUB1510(auVar11 << 0x30,5);
  auVar9[0] = auVar15[2];
  auVar12._11_4_ = 0;
  auVar12._0_11_ = auVar9;
  auVar10._1_12_ = SUB1512(auVar12 << 0x20,3);
  auVar10[0] = auVar15[1];
  uVar14 = 0xfefdfefe;
  do {
    uVar14 = uVar14 + 0x2020202;
    auVar51._4_4_ = uVar14;
    auVar51._0_4_ = uVar14;
    auVar51._8_4_ = uVar14;
    auVar51._12_4_ = uVar14;
    auVar35 = pshufb(auVar13,auVar51);
    auVar51 = pshufb(auVar16,auVar51);
    sVar50 = auVar51._0_2_ + 0x80;
    sVar52 = auVar51._2_2_ + 0x80;
    sVar53 = auVar51._4_2_ + 0x80;
    sVar54 = auVar51._6_2_ + 0x80;
    sVar55 = auVar51._8_2_ + 0x80;
    sVar56 = auVar51._10_2_ + 0x80;
    sVar57 = auVar51._12_2_ + 0x80;
    sVar58 = auVar51._14_2_ + 0x80;
    uVar17 = auVar35._0_2_ * (ushort)auVar15[0] + sVar50;
    uVar19 = auVar35._2_2_ * auVar10._0_2_ + sVar52;
    uVar21 = auVar35._4_2_ * auVar9._0_2_ + sVar53;
    uVar23 = auVar35._6_2_ * (short)Var8 + sVar54;
    uVar25 = auVar35._8_2_ * auVar6._8_2_ + sVar55;
    uVar27 = auVar35._10_2_ * auVar4._10_2_ + sVar56;
    uVar29 = auVar35._12_2_ * auVar2._12_2_ + sVar57;
    uVar31 = auVar35._14_2_ * (auVar1._13_2_ >> 8) + sVar58;
    uVar18 = uVar17 >> 8;
    uVar20 = uVar19 >> 8;
    uVar22 = uVar21 >> 8;
    uVar24 = uVar23 >> 8;
    uVar26 = uVar25 >> 8;
    uVar28 = uVar27 >> 8;
    uVar30 = uVar29 >> 8;
    uVar32 = uVar31 >> 8;
    uVar33 = auVar35._0_2_ * (ushort)auVar15[8] + sVar50;
    uVar36 = auVar35._2_2_ * (ushort)auVar15[9] + sVar52;
    uVar38 = auVar35._4_2_ * (ushort)auVar15[10] + sVar53;
    uVar40 = auVar35._6_2_ * (ushort)auVar15[0xb] + sVar54;
    uVar42 = auVar35._8_2_ * (ushort)auVar15[0xc] + sVar55;
    uVar44 = auVar35._10_2_ * (ushort)auVar15[0xd] + sVar56;
    uVar46 = auVar35._12_2_ * (ushort)auVar15[0xe] + sVar57;
    uVar48 = auVar35._14_2_ * (ushort)auVar15[0xf] + sVar58;
    uVar34 = uVar33 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    *dst = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
    dst[1] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
    dst[2] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
    dst[3] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
    dst[4] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
    dst[5] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
    dst[6] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    dst[7] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
    dst[8] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[9] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
    dst[10] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
    dst[0xb] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
    dst[0xc] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    dst[0xd] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
    dst[0xe] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[0xf] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    dst = dst + stride;
  } while (uVar14 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_16x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = cvtepu8_epi16(_mm_srli_si128(top, 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}